

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O1

void __thiscall BRTS<UFPC>::SecondScan(BRTS<UFPC> *this)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  Mat1i *pMVar4;
  long lVar5;
  uint *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  Run *pRVar10;
  Run *pRVar11;
  long lVar12;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar12 = (long)*(int *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  if (0 < lVar12) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar7 = *(long *)&pMVar4->field_0x10;
    lVar5 = **(long **)&pMVar4->field_0x48;
    lVar8 = 0;
    pRVar10 = (this->data_runs).runs;
    puVar6 = UFPC::P_;
    do {
      do {
        uVar1 = pRVar10->start_pos;
        uVar9 = (ulong)uVar1;
        if (uVar9 == 0xffff) {
          pRVar11 = pRVar10 + 1;
        }
        else {
          uVar2 = pRVar10->end_pos;
          pRVar11 = pRVar10;
          if (uVar1 < uVar2) {
            uVar3 = puVar6[pRVar10->label];
            do {
              *(uint *)(lVar7 + uVar9 * 4) = uVar3;
              uVar9 = uVar9 + 1;
            } while (uVar2 != uVar9);
          }
        }
        pRVar10 = pRVar11 + 1;
      } while (uVar1 != 0xffff);
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + lVar5;
      pRVar10 = pRVar11;
      puVar6 = UFPC::P_;
    } while (lVar8 != lVar12);
  }
  return;
}

Assistant:

void SecondScan() {
        int w(img_.cols);
        int h(img_.rows);

        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart);

        Run* runs = data_runs.runs;
        for (int i = 0; i < h; i++) {
            unsigned* const labels = img_labels_.ptr<unsigned>(i);
            for (;; runs++) {
                unsigned short start_pos = runs->start_pos;
                if (start_pos == 0xFFFF) {
                    runs++;
                    break;
                }
                unsigned short end_pos = runs->end_pos;
                int label = LabelsSolver::GetLabel(runs->label);
                for (int j = start_pos; j < end_pos; j++) labels[j] = label;
            }
        }
    }